

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_lib.cc
# Opt level: O2

uint AutoChooseFilterStrategy
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *image,uint w,uint h,
               State *inputstate,bool bit16,bool keep_colortype,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *origfile,int numstrategies,
               ZopfliPNGFilterStrategy *strategies,bool *enable)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  
  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = (ulong)(uint)numstrategies;
  if (numstrategies < 1) {
    uVar3 = 0;
  }
  uVar4 = 0;
  uVar2 = 0;
  for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
    if (out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    uVar1 = TryOptimize(image,w,h,inputstate,bit16,keep_colortype,origfile,strategies[uVar5],false,
                        0x2000,(ZopfliPNGOptions *)0x0,&out);
    if (uVar1 != 0) goto LAB_0010caf0;
    if ((ulong)((long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) <= uVar2 - 1) {
      uVar4 = uVar5 & 0xffffffff;
      uVar2 = (long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
  }
  uVar1 = 0;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    enable[uVar2] = uVar4 == uVar2;
  }
LAB_0010caf0:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return uVar1;
}

Assistant:

unsigned AutoChooseFilterStrategy(const std::vector<unsigned char>& image,
                                  unsigned w, unsigned h,
                                  const lodepng::State& inputstate,
                                  bool bit16, bool keep_colortype,
                                  const std::vector<unsigned char>& origfile,
                                  int numstrategies,
                                  ZopfliPNGFilterStrategy* strategies,
                                  bool* enable) {
  std::vector<unsigned char> out;
  size_t bestsize = 0;
  int bestfilter = 0;

  // A large window size should still be used to do the quick compression to
  // try out filter strategies: which filter strategy is the best depends
  // largely on the window size, the closer to the actual used window size the
  // better.
  int windowsize = 8192;

  for (int i = 0; i < numstrategies; i++) {
    out.clear();
    unsigned error = TryOptimize(image, w, h, inputstate, bit16, keep_colortype,
                                 origfile, strategies[i], false, windowsize, 0,
                                 &out);
    if (error) return error;
    if (bestsize == 0 || out.size() < bestsize) {
      bestsize = out.size();
      bestfilter = i;
    }
  }

  for (int i = 0; i < numstrategies; i++) {
    enable[i] = (i == bestfilter);
  }

  return 0;  /* OK */
}